

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

vm_obj_id_t CVmObjString::create(int in_root_set,char *src,size_t srclen,CCharmapToUni *cmap)

{
  vm_obj_id_t vVar1;
  size_t byte_size;
  
  byte_size = CCharmapToUni::map_str(cmap,(char *)0x0,0,src,srclen);
  vVar1 = create(in_root_set,byte_size);
  CCharmapToUni::map_str
            (cmap,(char *)(*(long *)((long)&G_obj_table_X.pages_[vVar1 >> 0xc][vVar1 & 0xfff].ptr_ +
                                    8) + 2),byte_size,src,srclen);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjString::create(VMG_ int in_root_set,
                                 const char *src, size_t srclen,
                                 CCharmapToUni *cmap)
{
    /* figure the size needed for the conversion */
    size_t ulen = cmap->map_str(0, 0, src, srclen);

    /* create a string of the mapped length */
    vm_obj_id_t ret = create(vmg_ in_root_set, ulen);
    CVmObjString *retstr = (CVmObjString *)vm_objp(vmg_ ret);

    /* map into the string buffer */
    cmap->map_str(retstr->cons_get_buf(), ulen, src, srclen);

    /* return the new string */
    return ret;
}